

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall
QStyleSheetStyle::drawPrimitive
          (QStyleSheetStyle *this,PrimitiveElement pe,QStyleOption *opt,QPainter *p,QWidget *w)

{
  QWidgetData *pQVar1;
  Data *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QStyleSheetStyle *pQVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  QStyle *pQVar10;
  long lVar11;
  QWidget *obj;
  undefined8 uVar12;
  undefined7 extraout_var;
  QAbstractScrollArea *this_01;
  QScrollBar *pQVar13;
  Node<const_QWidget_*,_QHashDummyValue> *pNVar14;
  undefined8 uVar15;
  QObject *obj_00;
  QRect *rect;
  int iVar16;
  undefined4 uVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  QRect QVar19;
  QStyleOptionTabWidgetFrame frmCopy;
  QRenderRule rule;
  QStyleOptionFrame frmOpt;
  QRect local_1e8;
  QWidget *local_1d8;
  undefined8 local_1d0;
  QPalette local_1b0 [6];
  QRenderRule local_150;
  undefined1 local_c8 [16];
  undefined1 local_b8 [12];
  Representation RStack_ac;
  undefined1 *local_a8;
  undefined1 auStack_a0 [16];
  QSharedDataPointer<QStyleSheetBoxData> QStack_90;
  QSharedDataPointer<QStyleSheetBackgroundData> local_88;
  QSharedDataPointer<QStyleSheetBorderData> QStack_80;
  long local_38;
  
  pQVar6 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar10 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,pe,opt,p,w,*(code **)(*(long *)pQVar10 + 0xb0))
      ;
      return;
    }
    goto LAB_003635b6;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_150,0xaa,0x88);
  renderRule(&local_150,this,&w->super_QObject,opt,0);
  local_1e8.x1.m_i = (opt->rect).x1.m_i;
  local_1e8.y1.m_i = (opt->rect).y1.m_i;
  local_1e8.x2.m_i = (opt->rect).x2.m_i;
  local_1e8.y2.m_i = (opt->rect).y2.m_i;
  if (PE_PanelMenu < pe) goto switchD_003624ad_caseD_5;
  rect = &opt->rect;
  iVar9 = 1;
  switch(pe) {
  case PE_Frame:
  case PE_FrameDockWidget:
  case PE_FrameWindow:
    if ((0 < opt->version) && (opt->type == 5)) {
      if ((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native)))) {
        local_c8 = (undefined1  [16])QRenderRule::borderRect(&local_150,rect);
        rect = (QRect *)local_c8;
        goto LAB_00362ff6;
      }
      local_88.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_80.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStack_90.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_c8,(QStyleOptionFrame *)opt);
      QRenderRule::configurePalette(&local_150,(QPalette *)auStack_a0,Text,Base);
      pQVar10 = baseStyle(this);
      lVar11 = *(long *)pQVar10;
LAB_0036255c:
      (**(code **)(lVar11 + 0xb0))(pQVar10,pe,local_c8,p,w);
LAB_00362566:
      QStyleOption::~QStyleOption((QStyleOption *)local_c8);
    }
    goto LAB_0036353f;
  case PE_FrameDefaultButton:
    if ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native)))) {
      bVar7 = QRenderRule::baseStyleCanDraw(&local_150);
      if (bVar7) goto switchD_003624ad_caseD_5;
      QWindowsStyle::drawPrimitive((QWindowsStyle *)this,PE_FrameDefaultButton,opt,p,w);
    }
    goto LAB_0036353f;
  case PE_FrameFocusRect:
    if ((local_150.ou.d.ptr == (QStyleSheetOutlineData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.ou.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_150.ou.d.ptr + 0x38) == BorderStyle_Native))))
    goto switchD_003624ad_caseD_5;
    QRenderRule::drawOutline(&local_150,p,rect);
    goto LAB_0036353f;
  case PE_FrameGroupBox:
    if ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native))))
    goto switchD_003624ad_caseD_5;
LAB_00362ff6:
    QRenderRule::drawBorder(&local_150,p,rect);
    goto LAB_0036353f;
  default:
    goto switchD_003624ad_caseD_5;
  case PE_FrameMenu:
  case PE_PanelMenuBar:
    bVar7 = QRenderRule::hasDrawable(&local_150);
    if (!bVar7) goto switchD_003624ad_caseD_5;
    goto LAB_0036353f;
  case PE_FrameStatusBarItem:
    memset(local_c8,0xaa,0x88);
    if (w == (QWidget *)0x0) {
      obj_00 = (QObject *)0x0;
    }
    else {
      obj_00 = *(QObject **)(*(long *)&w->field_0x8 + 0x10);
    }
    renderRule((QRenderRule *)local_c8,this,obj_00,opt,10);
    goto LAB_00363021;
  case PE_FrameTabWidget:
    if ((opt->version < 1) || (opt->type != 0xb)) goto switchD_003624ad_caseD_5;
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x36);
    if ((QStack_80.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_80.d.ptr + 0x68))->d).ptr
         == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)QStack_80.d.ptr + 0x38) == BorderStyle_Native)))) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1d0;
      _local_1d8 = (QRect)(auVar3 << 0x40);
      QRenderRule::drawBackground((QRenderRule *)local_c8,p,rect,(QPoint *)&local_1d8);
      memset((QStyleOptionTabWidgetFrame *)&local_1d8,0xaa,0x88);
      QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame
                ((QStyleOptionTabWidgetFrame *)&local_1d8,(QStyleOptionTabWidgetFrame *)opt);
      QRenderRule::configurePalette((QRenderRule *)local_c8,local_1b0,WindowText,Window);
      pQVar10 = baseStyle(this);
      (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,8,(QStyleOptionTabWidgetFrame *)&local_1d8,p,w)
      ;
      QStyleOption::~QStyleOption((QStyleOption *)&local_1d8);
    }
    else {
LAB_00362e57:
      QRenderRule::drawRule((QRenderRule *)local_c8,p,rect);
    }
    goto LAB_003632e2;
  case PE_PanelButtonCommand:
  case PE_PanelButtonTool:
    lVar11 = QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
    if ((((lVar11 == 0) || (local_150.bg.d.ptr == (QStyleSheetBackgroundData *)0x0)) ||
        ((cVar8 = QPixmap::isNull(), cVar8 != '\0' &&
         (*(int *)(*(long *)((long)local_150.bg.d.ptr + 8) + 4) == 0)))) ||
       ((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d)
          .ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      if ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d
           ).ptr == (QStyleSheetBorderImageData *)0x0 &&
          (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native))))
      goto switchD_003624ad_caseD_5;
      local_c8 = (undefined1  [16])QRenderRule::boxRect(&local_150,rect,1);
      rect = (QRect *)local_c8;
    }
    else {
      QWindowsStyle::drawPrimitive((QWindowsStyle *)this,pe,opt,p,w);
      cVar8 = QPixmap::isNull();
      if ((cVar8 != '\0') && (local_150.img.d.ptr == (QStyleSheetImageData *)0x0))
      goto LAB_0036353f;
      QVar19 = QRenderRule::boxRect(&local_150,rect,1);
      auVar18._12_4_ = QVar19.y2.m_i;
      auVar18._0_4_ = (undefined4)(QVar19._0_8_ + 1);
      auVar18._8_4_ = (undefined4)(QVar19._8_8_ + 0xffffffff);
      auVar18._4_4_ = auVar18._8_4_;
      rect = (QRect *)local_c8;
      local_c8._8_8_ = auVar18._8_8_ + -0x100000000;
      local_c8._0_8_ = CONCAT44(QVar19.y1.m_i.m_i,auVar18._0_4_) + 0x100000000;
    }
LAB_00363201:
    QRenderRule::drawRule(&local_150,p,rect);
    goto LAB_0036353f;
  case PE_PanelLineEdit:
    if ((0 < opt->version) && (opt->type == 5)) {
      if ((w != (QWidget *)0x0) && (obj = containerWidget(w), obj != w)) {
        memset((QRenderRule *)local_c8,0xaa,0x88);
        renderRule((QRenderRule *)local_c8,this,&obj->super_QObject,opt,0);
        if (((QStack_80.d.ptr != (QStyleSheetBorderData *)0x0) &&
            (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_80.d.ptr + 0x68))->d
              ).ptr != (QStyleSheetBorderImageData *)0x0 ||
             (*(BorderStyle *)((long)QStack_80.d.ptr + 0x38) != BorderStyle_Native)))) ||
           (bVar7 = QRenderRule::baseStyleCanDraw((QRenderRule *)local_c8), !bVar7))
        goto LAB_003632e2;
        QRenderRule::operator=(&local_150,(QRenderRule *)local_c8);
        QRenderRule::~QRenderRule((QRenderRule *)local_c8);
      }
      if ((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native))))
      goto LAB_00363201;
      local_88.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_80.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStack_90.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_c8,(QStyleOptionFrame *)opt);
      QRenderRule::configurePalette(&local_150,(QPalette *)auStack_a0,Text,Base);
      if (local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) {
      }
      else {
        uVar12._0_4_ = local_b8._0_4_ + *(int *)((long)local_150.b.d.ptr + 0x10);
        uVar15._0_4_ = local_b8._8_4_ - *(int *)((long)local_150.b.d.ptr + 8);
        uVar12._4_4_ = local_b8._4_4_ + *(int *)((long)local_150.b.d.ptr + 4);
        uVar15._4_4_ = RStack_ac.m_i - *(int *)((long)local_150.b.d.ptr + 0xc);
        local_b8._0_8_ = uVar12;
        unique0x100012b9 = uVar15;
      }
      local_b8._8_4_ = (int)register0x00000008;
      RStack_ac.m_i = SUB84(register0x00000008,4);
      local_b8._0_4_ = (int)local_b8._0_8_;
      local_b8._4_4_ = SUB84(local_b8._0_8_,4);
      bVar7 = QRenderRule::baseStyleCanDraw(&local_150);
      if (bVar7) {
        QRenderRule::drawBackgroundImage(&local_150,p,rect,(QPoint)0x0);
        uVar17 = 0x12;
      }
      else {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_1d0;
        _local_1d8 = (QRect)(auVar5 << 0x40);
        QRenderRule::drawBackground(&local_150,p,rect,(QPoint *)&local_1d8);
        uVar17 = 5;
        if ((int)local_88.d.ptr < 1) goto LAB_00362566;
      }
      pQVar10 = baseStyle(this);
      (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,uVar17,local_c8,p,w);
      goto LAB_00362566;
    }
    goto LAB_0036353f;
  case PE_IndicatorArrowDown:
    break;
  case PE_IndicatorArrowLeft:
    iVar9 = 3;
    break;
  case PE_IndicatorArrowRight:
    iVar9 = 4;
    break;
  case PE_IndicatorArrowUp:
    iVar9 = 2;
    break;
  case PE_IndicatorBranch:
    if ((0 < opt->version) && (opt->type == 10)) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x29);
      bVar7 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
      if (bVar7) {
        pQVar10 = QStyle::proxy((QStyle *)CONCAT71(extraout_var,bVar7));
        (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,0x2d,opt,p,w);
        goto LAB_00362e57;
      }
      pQVar10 = baseStyle(this);
      (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,0x17,opt,p,w);
      goto LAB_003632e2;
    }
    goto LAB_0036353f;
  case PE_IndicatorButtonDropDown:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x11);
    if ((QStack_80.d.ptr != (QStyleSheetBorderData *)0x0) &&
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_80.d.ptr + 0x68))->d).ptr
         != (QStyleSheetBorderImageData *)0x0 ||
        (*(BorderStyle *)((long)QStack_80.d.ptr + 0x38) != BorderStyle_Native)))) {
      QRenderRule::drawBorder(&local_150,p,rect);
      goto LAB_003632e2;
    }
    goto LAB_00363051;
  case PE_IndicatorItemViewItemCheck:
    iVar9 = 0x4d;
    break;
  case PE_IndicatorCheckBox:
    iVar9 = 5;
    break;
  case PE_IndicatorDockWidgetResizeHandle:
    iVar9 = 0x3d;
    break;
  case PE_IndicatorHeaderArrow:
    if ((0 < opt->version) && (opt->type == 8)) {
      iVar9 = (*(int *)((long)&opt[1].styleObject + 4) != 1) + 0x2b;
      break;
    }
    goto switchD_003624ad_caseD_5;
  case PE_IndicatorMenuCheckMark:
    iVar9 = 0x25;
    break;
  case PE_IndicatorProgressChunk:
    iVar9 = 0x2d;
    break;
  case PE_IndicatorRadioButton:
    iVar9 = 6;
    break;
  case PE_IndicatorSpinDown:
  case PE_IndicatorSpinMinus:
    iVar9 = 0xe;
    break;
  case PE_IndicatorSpinPlus:
  case PE_IndicatorSpinUp:
    iVar9 = 0xc;
    break;
  case PE_IndicatorToolBarHandle:
  case PE_IndicatorToolBarSeparator:
    memset(local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,
               (pe != PE_IndicatorToolBarHandle) + 0x21);
LAB_00363021:
    bVar7 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
    if (!bVar7) {
LAB_00363051:
      QRenderRule::~QRenderRule((QRenderRule *)local_c8);
      goto switchD_003624ad_caseD_5;
    }
    QRenderRule::drawRule((QRenderRule *)local_c8,p,rect);
LAB_003632e2:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    goto LAB_0036353f;
  case PE_PanelTipLabel:
    bVar7 = QRenderRule::hasDrawable(&local_150);
    if (!bVar7) goto switchD_003624ad_caseD_5;
    if ((0 < opt->version) && (opt->type == 5)) {
      if ((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native))))
      goto LAB_00363201;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_c8._8_8_;
      local_c8 = auVar4 << 0x40;
      QRenderRule::drawBackground(&local_150,p,rect,(QPoint *)local_c8);
      local_88.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_80.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStack_90.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_c8,(QStyleOptionFrame *)opt);
      _local_b8 = QRenderRule::borderRect(&local_150,rect);
      QBrush::QBrush((QBrush *)&local_1d8,NoBrush);
      QPalette::setBrush((ColorGroup)auStack_a0,Mid,(QBrush *)&DAT_0000000a);
      QBrush::~QBrush((QBrush *)&local_1d8);
      pQVar10 = baseStyle(this);
      lVar11 = *(long *)pQVar10;
      pe = PE_PanelTipLabel;
      goto LAB_0036255c;
    }
    goto LAB_0036353f;
  case PE_IndicatorTabTear:
    iVar9 = 0x30;
    break;
  case PE_PanelScrollAreaCorner:
    iVar9 = 0x4e;
    break;
  case PE_Widget:
    if (w != (QWidget *)0x0) {
      bVar7 = QRenderRule::hasDrawable(&local_150);
      if (!bVar7) {
        local_1d8 = containerWidget(w);
        this_00 = (styleSheetCaches->autoFillDisabledWidgets).q_hash.d;
        if ((this_00 != (Data *)0x0) &&
           (pNVar14 = QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>>::
                      findNode<QWidget_const*>
                                ((Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>> *)this_00
                                 ,&local_1d8),
           pNVar14 != (Node<const_QWidget_*,_QHashDummyValue> *)0x0)) {
          if (local_1d8 != w) {
            renderRule((QRenderRule *)local_c8,this,&local_1d8->super_QObject,opt,0);
            if (local_88.d.ptr == (QStyleSheetBackgroundData *)0x0) {
              QRenderRule::~QRenderRule((QRenderRule *)local_c8);
            }
            else {
              cVar8 = QPixmap::isNull();
              if (cVar8 == '\0') goto LAB_00363051;
              iVar9 = *(int *)(*(long *)((long)local_88.d.ptr + 8) + 4);
              QRenderRule::~QRenderRule((QRenderRule *)local_c8);
              if (iVar9 != 0) goto switchD_003624ad_caseD_5;
            }
          }
          QWidget::backgroundRole(w);
          QPalette::brush((int)opt + 0x28,Dark);
          QPainter::fillRect((QRect *)p,(QBrush *)rect);
        }
        goto switchD_003624ad_caseD_5;
      }
    }
    this_01 = (QAbstractScrollArea *)
              QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
    if (this_01 == (QAbstractScrollArea *)0x0) goto switchD_003624ad_caseD_2e;
    local_c8._0_8_ = (**(code **)(**(long **)(this_01 + 8) + 0xb8))();
    QRenderRule::drawBackground(&local_150,p,rect,(QPoint *)local_c8);
    if (local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
      local_c8 = (undefined1  [16])QRenderRule::borderRect(&local_150,rect);
      iVar16 = 0;
      iVar9 = (**(code **)(*(long *)this + 0xf0))(this,0x11,opt,w,0);
      if (iVar9 != 0) {
        pQVar13 = QAbstractScrollArea::verticalScrollBar(this_01);
        if ((((pQVar13->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0
           ) {
          pQVar13 = QAbstractScrollArea::verticalScrollBar(this_01);
          pQVar1 = (pQVar13->super_QAbstractSlider).super_QWidget.data;
          iVar16 = ~(pQVar1->crect).x2.m_i + (pQVar1->crect).x1.m_i;
        }
        pQVar13 = QAbstractScrollArea::horizontalScrollBar(this_01);
        iVar9 = 0;
        if ((((pQVar13->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0
           ) {
          pQVar13 = QAbstractScrollArea::horizontalScrollBar(this_01);
          pQVar1 = (pQVar13->super_QAbstractSlider).super_QWidget.data;
          iVar9 = ~(pQVar1->crect).y2.m_i + (pQVar1->crect).y1.m_i;
        }
        auVar2 = local_c8;
        local_1d0._4_4_ = iVar9 + local_c8._12_4_;
        local_1d0._0_4_ = iVar16 + local_c8._8_4_;
        local_1d8._0_4_ = local_c8._0_4_;
        local_1d8._4_4_ = local_c8._4_4_;
        local_c8 = auVar2;
        local_c8 = (undefined1  [16])
                   QStyle::visualRect(opt->direction,(QRect *)local_c8,(QRect *)&local_1d8);
      }
      QRenderRule::drawBorder(&local_150,p,(QRect *)local_c8);
    }
    goto switchD_003624ad_caseD_5;
  case PE_IndicatorColumnViewArrow:
    iVar9 = 4;
    if ((0 < opt->version) && (opt->type == 10)) {
      iVar9 = (opt->direction != RightToLeft) + 3;
    }
    break;
  case PE_PanelItemViewItem:
switchD_003624ad_caseD_2c:
    iVar9 = 0x4a;
    break;
  case PE_PanelItemViewRow:
    if (((0 < opt->version) && (opt->type == 10)) && (opt[3].version != 0)) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x4a);
      if (local_88.d.ptr != (QStyleSheetBackgroundData *)0x0) {
        cVar8 = QPixmap::isNull();
        if ((cVar8 == '\0') || (*(int *)(*(long *)((long)local_88.d.ptr + 8) + 4) != 0)) {
          iVar9 = QColor::alpha();
          if (iVar9 != 1) {
            pQVar10 = baseStyle(this);
            (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,0x2d,opt,p,w);
          }
          if (((((ulong)opt[1].palette.d & 0x4000000000) != 0) &&
              ((opt[3].version == 4 || (opt[3].version == 1)))) &&
             (QStack_80.d.ptr != (QStyleSheetBorderData *)0x0)) {
            bVar7 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
            if (bVar7) {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_1d0;
              _local_1d8 = (QRect)(auVar2 << 0x40);
              QRenderRule::drawBackground((QRenderRule *)local_c8,p,&local_1e8,(QPoint *)&local_1d8)
              ;
              _local_1d8 = QRenderRule::contentsRect((QRenderRule *)local_c8,&local_1e8);
              QRenderRule::drawImage((QRenderRule *)local_c8,p,(QRect *)&local_1d8);
            }
            else {
              pQVar10 = baseStyle(this);
              (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,0x2d,opt,p,w);
            }
            QRenderRule::~QRenderRule((QRenderRule *)local_c8);
            goto LAB_0036353f;
          }
          QRenderRule::~QRenderRule((QRenderRule *)local_c8);
          goto switchD_003624ad_caseD_2c;
        }
      }
      goto LAB_00363051;
    }
    goto switchD_003624ad_caseD_5;
  case PE_PanelStatusBar:
  case PE_PanelMenu:
switchD_003624ad_caseD_2e:
    bVar7 = QRenderRule::hasDrawable(&local_150);
    if (bVar7) goto LAB_00363201;
switchD_003624ad_caseD_5:
    pQVar10 = baseStyle(this);
    (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,pe,opt,p,w);
    goto LAB_003634c1;
  case PE_IndicatorTabClose:
    iVar9 = 0x4f;
    if (w == (QWidget *)0x0) {
      w = (QWidget *)0x0;
    }
    else {
      pQVar10 = baseStyle(this);
      local_1d8 = w;
      ::QVariant::fromValue<void_*,_true>
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)local_c8,&local_1d8);
      QObject::doSetProperty
                ((char *)pQVar10,(QVariant *)"_q_styleSheetRealCloseButton",
                 (enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)local_c8);
      ::QVariant::~QVariant
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)local_c8);
      iVar9 = 0x4f;
      w = *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
    }
  }
  memset((QRenderRule *)local_c8,0xaa,0x88);
  renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,iVar9);
  bVar7 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
  if (bVar7) {
    QRenderRule::drawRule((QRenderRule *)local_c8,p,&local_1e8);
  }
  else {
    pQVar10 = baseStyle(this);
    (**(code **)(*(long *)pQVar10 + 0xb0))(pQVar10,pe,opt,p,w);
  }
  QRenderRule::~QRenderRule((QRenderRule *)local_c8);
LAB_003634c1:
  baseStyle(this);
  QObject::property((char *)local_c8);
  cVar8 = ::QVariant::toBool();
  ::QVariant::~QVariant((QVariant *)local_c8);
  if (cVar8 != '\0') {
    pQVar10 = baseStyle(this);
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    _local_b8 = (QRect)(ZEXT816(2) << 0x40);
    QObject::doSetProperty
              ((char *)pQVar10,(QVariant *)"_q_styleSheetRealCloseButton",(QVariant *)local_c8);
    ::QVariant::~QVariant((QVariant *)local_c8);
  }
LAB_0036353f:
  QRenderRule::~QRenderRule(&local_150);
  if (pQVar6 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003635b6:
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::drawPrimitive(PrimitiveElement pe, const QStyleOption *opt, QPainter *p,
                                     const QWidget *w) const
{
    RECURSION_GUARD(baseStyle()->drawPrimitive(pe, opt, p, w); return)

    int pseudoElement = PseudoElement_None;
    QRenderRule rule = renderRule(w, opt);
    QRect rect = opt->rect;

    switch (pe) {

    case PE_FrameStatusBarItem: {
        QRenderRule subRule = renderRule(w ? w->parentWidget() : nullptr, opt, PseudoElement_Item);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
        break;
                            }

    case PE_IndicatorArrowDown:
        pseudoElement = PseudoElement_DownArrow;
        break;

    case PE_IndicatorArrowUp:
        pseudoElement = PseudoElement_UpArrow;
        break;

    case PE_IndicatorRadioButton:
        pseudoElement = PseudoElement_ExclusiveIndicator;
        break;

    case PE_IndicatorItemViewItemCheck:
        pseudoElement = PseudoElement_ViewItemIndicator;
        break;

    case PE_IndicatorCheckBox:
        pseudoElement = PseudoElement_Indicator;
        break;

    case PE_IndicatorHeaderArrow:
        if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            pseudoElement = hdr->sortIndicator == QStyleOptionHeader::SortUp
                ? PseudoElement_HeaderViewUpArrow
                : PseudoElement_HeaderViewDownArrow;
        }
        break;

    case PE_PanelButtonTool:
    case PE_PanelButtonCommand:
#if QT_CONFIG(abstractbutton)
        if (qobject_cast<const QAbstractButton *>(w) && rule.hasBackground() && rule.hasNativeBorder()) {
            //the window style will draw the borders
            ParentStyle::drawPrimitive(pe, opt, p, w);
            if (!rule.background()->pixmap.isNull() || rule.hasImage()) {
                rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin).adjusted(1,1,-1,-1));
            }
            return;
        }
#endif
        if (!rule.hasNativeBorder()) {
            rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin));
            return;
        }
        break;

    case PE_IndicatorButtonDropDown: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
        if (!subRule.hasNativeBorder()) {
            rule.drawBorder(p, opt->rect);
            return;
        }
        break;
                                     }

    case PE_FrameDefaultButton:
        if (rule.hasNativeBorder()) {
            if (rule.baseStyleCanDraw())
                break;
            QWindowsStyle::drawPrimitive(pe, opt, p, w);
        }
        return;

    case PE_FrameWindow:
    case PE_FrameDockWidget:
    case PE_Frame:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
            } else {
                rule.drawBorder(p, rule.borderRect(opt->rect));
            }
        }
        return;

    case PE_PanelLineEdit:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            // Fall back to container widget's render rule
            if (w) {
                if (QWidget *container = containerWidget(w); container != w) {
                    QRenderRule containerRule = renderRule(container, opt);
                    if (!containerRule.hasNativeBorder() || !containerRule.baseStyleCanDraw())
                        return;
                    rule = containerRule;
                }
            }

            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                frmOpt.rect = rule.borderRect(frmOpt.rect);
                if (rule.baseStyleCanDraw()) {
                    rule.drawBackgroundImage(p, opt->rect);
                    baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
                } else {
                    rule.drawBackground(p, opt->rect);
                    if (frmOpt.lineWidth > 0)
                        baseStyle()->drawPrimitive(PE_FrameLineEdit, &frmOpt, p, w);
                }
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_Widget:
        if (w && !rule.hasDrawable()) {
            QWidget *container = containerWidget(w);
            if (styleSheetCaches->autoFillDisabledWidgets.contains(container)
                && (container == w || !renderRule(container, opt).hasBackground())) {
                //we do not have a background, but we disabled the autofillbackground anyway. so fill the background now.
                // (this may happen if we have rules like :focus)
                p->fillRect(opt->rect, opt->palette.brush(w->backgroundRole()));
            }
            break;
        }
#if QT_CONFIG(scrollarea)
        if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w)) {
            const QAbstractScrollAreaPrivate *sap = sa->d_func();
            rule.drawBackground(p, opt->rect, sap->contentsOffset());
            if (rule.hasBorder()) {
                QRect brect = rule.borderRect(opt->rect);
                if (styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, opt, w)) {
                    QRect r = brect.adjusted(0, 0, sa->verticalScrollBar()->isVisible() ? -sa->verticalScrollBar()->width() : 0,
                                             sa->horizontalScrollBar()->isVisible() ? -sa->horizontalScrollBar()->height() : 0);
                    brect = QStyle::visualRect(opt->direction, brect, r);
                }
                rule.drawBorder(p, brect);
            }
            break;
        }
#endif
        Q_FALLTHROUGH();
    case PE_PanelMenu:
    case PE_PanelStatusBar:
        if (rule.hasDrawable()) {
            rule.drawRule(p, opt->rect);
            return;
        }
    break;

    case PE_FrameMenu:
        if (rule.hasDrawable()) {
            // Drawn by PE_PanelMenu
            return;
        }
        break;

    case PE_PanelMenuBar:
    if (rule.hasDrawable()) {
        // Drawn by PE_Widget
        return;
    }
    break;

    case PE_IndicatorToolBarSeparator:
    case PE_IndicatorToolBarHandle: {
        PseudoElement ps = pe == PE_IndicatorToolBarHandle ? PseudoElement_ToolBarHandle : PseudoElement_ToolBarSeparator;
        QRenderRule subRule = renderRule(w, opt, ps);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
                                    }
        break;

    case PE_IndicatorMenuCheckMark:
        pseudoElement = PseudoElement_MenuCheckMark;
        break;

    case PE_IndicatorArrowLeft:
        pseudoElement = PseudoElement_LeftArrow;
        break;

    case PE_IndicatorArrowRight:
        pseudoElement = PseudoElement_RightArrow;
        break;

    case PE_IndicatorColumnViewArrow:
#if QT_CONFIG(itemviews)
        if (const QStyleOptionViewItem *viewOpt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            bool reverse = (viewOpt->direction == Qt::RightToLeft);
            pseudoElement = reverse ? PseudoElement_LeftArrow : PseudoElement_RightArrow;
        } else
#endif
        {
            pseudoElement = PseudoElement_RightArrow;
        }
        break;

#if QT_CONFIG(itemviews)
    case PE_IndicatorBranch:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TreeViewBranch);
            if (subRule.hasDrawable()) {
                proxy()->drawPrimitive(PE_PanelItemViewRow, vopt, p, w);
                subRule.drawRule(p, opt->rect);
            } else {
                baseStyle()->drawPrimitive(pe, vopt, p, w);
            }
        }
        return;
#endif // QT_CONFIG(itemviews)

    case PE_PanelTipLabel:
        if (!rule.hasDrawable())
            break;

        if (const QStyleOptionFrame *frmOpt = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                rule.drawBackground(p, opt->rect);
                QStyleOptionFrame optCopy(*frmOpt);
                optCopy.rect = rule.borderRect(opt->rect);
                optCopy.palette.setBrush(QPalette::Window, Qt::NoBrush); // oh dear
                baseStyle()->drawPrimitive(pe, &optCopy, p, w);
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_FrameGroupBox:
        if (rule.hasNativeBorder())
            break;
        rule.drawBorder(p, opt->rect);
        return;

#if QT_CONFIG(tabwidget)
    case PE_FrameTabWidget:
        if (const QStyleOptionTabWidgetFrame *frm = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TabWidgetPane);
            if (subRule.hasNativeBorder()) {
                subRule.drawBackground(p, opt->rect);
                QStyleOptionTabWidgetFrame frmCopy(*frm);
                subRule.configurePalette(&frmCopy.palette, QPalette::WindowText, QPalette::Window);
                baseStyle()->drawPrimitive(pe, &frmCopy, p, w);
            } else {
                subRule.drawRule(p, opt->rect);
            }
            return;
        }
        break;
#endif // QT_CONFIG(tabwidget)

    case PE_IndicatorProgressChunk:
        pseudoElement = PseudoElement_ProgressBarChunk;
        break;

    case PE_IndicatorTabTear:
        pseudoElement = PseudoElement_TabBarTear;
        break;

    case PE_FrameFocusRect:
        if (!rule.hasNativeOutline()) {
            rule.drawOutline(p, opt->rect);
            return;
        }
        break;

    case PE_IndicatorDockWidgetResizeHandle:
        pseudoElement = PseudoElement_DockWidgetSeparator;
        break;

    case PE_PanelItemViewRow:
        // For compatibility reasons, QTreeView draws different parts of
        // the background of an item row separately, before calling the
        // delegate to draw the item. The row background of an item is
        // however not separately styleable through a style sheet, but
        // only indirectly through the background of the item. To get the
        // same background for all parts drawn by QTreeView, we have to
        // use the background rule for the item here.
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            // default handling for drawing empty space
            if (vopt->viewItemPosition == QStyleOptionViewItem::Invalid)
                break;
            if (QRenderRule rule = renderRule(w, opt, PseudoElement_ViewItem); rule.hasBackground()) {
                // if the item background is not fully opaque, then we have to paint the row
                if (rule.background()->brush.color().alpha() != 1.0)
                    baseStyle()->drawPrimitive(pe, opt, p, w);
                // Skip border for the branch and draw only the brackground
                if (vopt->features & QStyleOptionViewItem::IsDecorationForRootColumn &&
                    (vopt->viewItemPosition == QStyleOptionViewItem::Beginning ||
                     vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne) && rule.hasBorder()) {
                    if (rule.hasDrawable()) {
                        rule.drawBackground(p, rect);
                        rule.drawImage(p, rule.contentsRect(rect));
                    } else {
                        baseStyle()->drawPrimitive(pe, opt, p, w);
                    }
                    return;
                }
                pseudoElement = PseudoElement_ViewItem;
            }
        }
        break;
    case PE_PanelItemViewItem:
        pseudoElement = PseudoElement_ViewItem;
        break;

    case PE_PanelScrollAreaCorner:
        pseudoElement = PseudoElement_ScrollAreaCorner;
        break;

    case PE_IndicatorSpinDown:
    case PE_IndicatorSpinMinus:
        pseudoElement = PseudoElement_SpinBoxDownArrow;
        break;

    case PE_IndicatorSpinUp:
    case PE_IndicatorSpinPlus:
        pseudoElement = PseudoElement_SpinBoxUpArrow;
        break;
#if QT_CONFIG(tabbar)
    case PE_IndicatorTabClose:
        if (w) {
            // QMacStyle needs a real widget, not its parent - to implement
            // 'document mode' properly, drawing nothing if a tab is not hovered.
            baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant::fromValue((void *)w));
            w = w->parentWidget(); //match on the QTabBar instead of the CloseButton
        }
        pseudoElement = PseudoElement_TabBarTabCloseButton;
        break;
#endif

    default:
        break;
    }

    if (pseudoElement != PseudoElement_None) {
        QRenderRule subRule = renderRule(w, opt, pseudoElement);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, rect);
        } else {
            baseStyle()->drawPrimitive(pe, opt, p, w);
        }
    } else {
        baseStyle()->drawPrimitive(pe, opt, p, w);
    }

    if (baseStyle()->property("_q_styleSheetRealCloseButton").toBool())
        baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant());
}